

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void x25519_sc_reduce(uint8_t *s)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int64_t iVar34;
  long lVar35;
  int64_t iVar36;
  long lVar37;
  int64_t iVar38;
  long lVar39;
  int64_t iVar40;
  long lVar41;
  int64_t iVar42;
  long lVar43;
  int64_t iVar44;
  int64_t iVar45;
  long lVar46;
  int64_t iVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  int64_t iVar52;
  int64_t iVar53;
  int64_t iVar54;
  int64_t iVar55;
  long lVar56;
  int64_t carry16;
  int64_t carry15;
  int64_t carry14;
  int64_t carry13;
  int64_t carry12;
  int64_t carry11;
  int64_t carry10;
  int64_t carry9;
  int64_t carry8;
  int64_t carry7;
  int64_t carry6;
  int64_t carry5;
  int64_t carry4;
  int64_t carry3;
  int64_t carry2;
  int64_t carry1;
  int64_t carry0;
  int64_t s23;
  int64_t s22;
  int64_t s21;
  int64_t s20;
  int64_t s19;
  int64_t s18;
  int64_t s17;
  int64_t s16;
  int64_t s15;
  int64_t s14;
  int64_t s13;
  int64_t s12;
  int64_t s11;
  int64_t s10;
  int64_t s9;
  int64_t s8;
  int64_t s7;
  int64_t s6;
  int64_t s5;
  int64_t s4;
  int64_t s3;
  int64_t s2;
  int64_t s1;
  int64_t s0;
  uint8_t *s_local;
  
  uVar1 = load_3(s);
  uVar2 = load_4(s + 2);
  uVar3 = load_3(s + 5);
  uVar4 = load_4(s + 7);
  uVar5 = load_4(s + 10);
  uVar6 = load_3(s + 0xd);
  uVar7 = load_4(s + 0xf);
  uVar8 = load_3(s + 0x12);
  uVar9 = load_3(s + 0x15);
  uVar10 = load_4(s + 0x17);
  uVar11 = load_3(s + 0x1a);
  uVar12 = load_4(s + 0x1c);
  uVar13 = load_4(s + 0x1f);
  uVar14 = load_3(s + 0x22);
  uVar15 = load_4(s + 0x24);
  uVar16 = load_3(s + 0x27);
  uVar17 = load_3(s + 0x2a);
  uVar18 = load_4(s + 0x2c);
  uVar19 = load_3(s + 0x2f);
  uVar20 = uVar19 >> 2 & 0x1fffff;
  uVar19 = load_4(s + 0x31);
  uVar21 = uVar19 >> 7 & 0x1fffff;
  uVar19 = load_4(s + 0x34);
  uVar22 = uVar19 >> 4 & 0x1fffff;
  uVar19 = load_3(s + 0x37);
  uVar23 = uVar19 >> 1 & 0x1fffff;
  uVar19 = load_4(s + 0x39);
  uVar24 = uVar19 >> 6 & 0x1fffff;
  uVar19 = load_4(s + 0x3c);
  uVar25 = uVar19 >> 3;
  lVar26 = (uVar17 & 0x1fffff) + uVar25 * -0xa6f7d;
  lVar27 = uVar24 * 0x215d1 + (uVar15 >> 6 & 0x1fffff) + uVar25 * -0xf39ad + uVar23 * -0xa6f7d;
  lVar28 = uVar22 * 0x215d1 +
           uVar24 * 0x9fb67 + uVar25 * 0x72d18 + (uVar13 >> 4 & 0x1fffff) + uVar23 * -0xf39ad +
           uVar21 * -0xa6f7d;
  lVar29 = uVar20 * 0xa2c13 + (uVar7 >> 6 & 0x1fffff);
  lVar30 = uVar20 * 0x9fb67 + uVar21 * 0x72d18 + uVar22 * 0xa2c13 + (uVar9 & 0x1fffff);
  lVar31 = uVar20 * 0x215d1 +
           uVar22 * 0x9fb67 + uVar23 * 0x72d18 + uVar24 * 0xa2c13 + (uVar11 >> 2 & 0x1fffff) +
           uVar21 * -0xf39ad;
  lVar32 = lVar29 + 0x100000 >> 0x15;
  lVar33 = lVar32 + uVar20 * 0x72d18 + uVar21 * 0xa2c13 + (uVar8 >> 3 & 0x1fffff);
  iVar34 = int64_lshift21(lVar32);
  lVar32 = lVar30 + 0x100000 >> 0x15;
  lVar35 = lVar32 + uVar21 * 0x9fb67 +
                    uVar22 * 0x72d18 + uVar23 * 0xa2c13 + (uVar10 >> 5 & 0x1fffff) +
                    uVar20 * -0xf39ad;
  iVar36 = int64_lshift21(lVar32);
  lVar32 = lVar31 + 0x100000 >> 0x15;
  lVar37 = lVar32 + uVar21 * 0x215d1 +
                    uVar23 * 0x9fb67 +
                    uVar24 * 0x72d18 + uVar25 * 0xa2c13 + (uVar12 >> 7 & 0x1fffff) +
                    uVar22 * -0xf39ad + uVar20 * -0xa6f7d;
  iVar38 = int64_lshift21(lVar32);
  lVar32 = lVar28 + 0x100000 >> 0x15;
  lVar39 = lVar32 + uVar23 * 0x215d1 +
                    uVar25 * 0x9fb67 + (uVar14 >> 1 & 0x1fffff) + uVar24 * -0xf39ad +
                    uVar22 * -0xa6f7d;
  iVar40 = int64_lshift21(lVar32);
  lVar32 = lVar27 + 0x100000 >> 0x15;
  lVar41 = lVar32 + uVar25 * 0x215d1 + (uVar16 >> 3 & 0x1fffff) + uVar24 * -0xa6f7d;
  iVar42 = int64_lshift21(lVar32);
  lVar32 = lVar26 + 0x100000 >> 0x15;
  lVar43 = lVar32 + (uVar18 >> 5 & 0x1fffff);
  iVar44 = int64_lshift21(lVar32);
  lVar32 = lVar33 + 0x100000 >> 0x15;
  iVar45 = int64_lshift21(lVar32);
  lVar46 = lVar35 + 0x100000 >> 0x15;
  iVar47 = int64_lshift21(lVar46);
  lVar48 = lVar37 + 0x100000 >> 0x15;
  lVar28 = lVar48 + (lVar28 - iVar40);
  iVar40 = int64_lshift21(lVar48);
  lVar48 = lVar39 + 0x100000 >> 0x15;
  lVar27 = lVar48 + (lVar27 - iVar42);
  iVar42 = int64_lshift21(lVar48);
  lVar39 = lVar39 - iVar42;
  lVar48 = lVar41 + 0x100000 >> 0x15;
  lVar26 = lVar48 + (lVar26 - iVar44);
  iVar42 = int64_lshift21(lVar48);
  lVar41 = lVar41 - iVar42;
  lVar31 = lVar46 + (lVar31 - iVar38) + lVar43 * -0xa6f7d;
  lVar30 = lVar26 * 0x215d1 + lVar32 + (lVar30 - iVar36) + lVar43 * -0xf39ad + lVar41 * -0xa6f7d;
  lVar29 = lVar27 * 0x215d1 +
           lVar26 * 0x9fb67 + lVar43 * 0x72d18 + (lVar29 - iVar34) + lVar41 * -0xf39ad +
           lVar39 * -0xa6f7d;
  lVar32 = lVar28 * 0xa2c13 + (uVar1 & 0x1fffff);
  lVar46 = lVar28 * 0x9fb67 + lVar39 * 0x72d18 + lVar27 * 0xa2c13 + (uVar3 >> 2 & 0x1fffff);
  lVar48 = lVar28 * 0x215d1 +
           lVar27 * 0x9fb67 + lVar41 * 0x72d18 + lVar26 * 0xa2c13 + (uVar5 >> 4 & 0x1fffff) +
           lVar39 * -0xf39ad;
  lVar49 = lVar32 + 0x100000 >> 0x15;
  lVar50 = lVar49 + lVar28 * 0x72d18 + lVar39 * 0xa2c13 + (uVar2 >> 5 & 0x1fffff);
  iVar34 = int64_lshift21(lVar49);
  lVar49 = lVar46 + 0x100000 >> 0x15;
  lVar51 = lVar49 + lVar39 * 0x9fb67 + lVar27 * 0x72d18 + lVar41 * 0xa2c13 + (uVar4 >> 7 & 0x1fffff)
                    + lVar28 * -0xf39ad;
  iVar36 = int64_lshift21(lVar49);
  lVar49 = lVar48 + 0x100000 >> 0x15;
  lVar28 = lVar49 + lVar39 * 0x215d1 +
                    lVar41 * 0x9fb67 + lVar26 * 0x72d18 + lVar43 * 0xa2c13 + (uVar6 >> 1 & 0x1fffff)
                    + lVar27 * -0xf39ad + lVar28 * -0xa6f7d;
  iVar38 = int64_lshift21(lVar49);
  lVar39 = lVar29 + 0x100000 >> 0x15;
  lVar27 = lVar39 + lVar41 * 0x215d1 + lVar43 * 0x9fb67 + (lVar33 - iVar45) + lVar26 * -0xf39ad +
                    lVar27 * -0xa6f7d;
  iVar42 = int64_lshift21(lVar39);
  lVar33 = lVar30 + 0x100000 >> 0x15;
  lVar26 = lVar33 + lVar43 * 0x215d1 + (lVar35 - iVar47) + lVar26 * -0xa6f7d;
  iVar44 = int64_lshift21(lVar33);
  lVar33 = lVar31 + 0x100000 >> 0x15;
  lVar35 = lVar33 + (lVar37 - iVar40);
  iVar40 = int64_lshift21(lVar33);
  lVar33 = lVar50 + 0x100000 >> 0x15;
  iVar45 = int64_lshift21(lVar33);
  lVar37 = lVar51 + 0x100000 >> 0x15;
  iVar47 = int64_lshift21(lVar37);
  lVar43 = lVar28 + 0x100000 >> 0x15;
  iVar52 = int64_lshift21(lVar43);
  lVar39 = lVar27 + 0x100000 >> 0x15;
  iVar53 = int64_lshift21(lVar39);
  lVar41 = lVar26 + 0x100000 >> 0x15;
  iVar54 = int64_lshift21(lVar41);
  lVar49 = lVar35 + 0x100000 >> 0x15;
  iVar55 = int64_lshift21(lVar49);
  lVar32 = lVar49 * 0xa2c13 + (lVar32 - iVar34);
  lVar56 = lVar32 >> 0x15;
  lVar50 = lVar56 + lVar49 * 0x72d18 + (lVar50 - iVar45);
  iVar34 = int64_lshift21(lVar56);
  lVar56 = lVar50 >> 0x15;
  lVar33 = lVar56 + lVar49 * 0x9fb67 + lVar33 + (lVar46 - iVar36);
  iVar36 = int64_lshift21(lVar56);
  lVar46 = lVar33 >> 0x15;
  lVar51 = lVar46 + (lVar51 - iVar47) + lVar49 * -0xf39ad;
  iVar45 = int64_lshift21(lVar46);
  lVar46 = lVar51 >> 0x15;
  lVar37 = lVar46 + lVar49 * 0x215d1 + lVar37 + (lVar48 - iVar38);
  iVar38 = int64_lshift21(lVar46);
  lVar46 = lVar37 >> 0x15;
  lVar28 = lVar46 + (lVar28 - iVar52) + lVar49 * -0xa6f7d;
  iVar47 = int64_lshift21(lVar46);
  lVar46 = lVar28 >> 0x15;
  lVar29 = lVar46 + lVar43 + (lVar29 - iVar42);
  iVar42 = int64_lshift21(lVar46);
  lVar43 = lVar29 >> 0x15;
  lVar27 = lVar43 + (lVar27 - iVar53);
  iVar52 = int64_lshift21(lVar43);
  lVar43 = lVar27 >> 0x15;
  lVar30 = lVar43 + lVar39 + (lVar30 - iVar44);
  iVar44 = int64_lshift21(lVar43);
  lVar43 = lVar30 >> 0x15;
  lVar26 = lVar43 + (lVar26 - iVar54);
  iVar53 = int64_lshift21(lVar43);
  lVar43 = lVar26 >> 0x15;
  lVar31 = lVar43 + lVar41 + (lVar31 - iVar40);
  iVar40 = int64_lshift21(lVar43);
  lVar43 = lVar31 >> 0x15;
  lVar35 = lVar43 + (lVar35 - iVar55);
  iVar54 = int64_lshift21(lVar43);
  lVar43 = lVar35 >> 0x15;
  iVar55 = int64_lshift21(lVar43);
  lVar46 = lVar43 * 0xa2c13 + (lVar32 - iVar34);
  lVar32 = lVar46 >> 0x15;
  lVar48 = lVar32 + lVar43 * 0x72d18 + (lVar50 - iVar36);
  iVar34 = int64_lshift21(lVar32);
  lVar46 = lVar46 - iVar34;
  lVar32 = lVar48 >> 0x15;
  lVar33 = lVar32 + lVar43 * 0x9fb67 + (lVar33 - iVar45);
  iVar34 = int64_lshift21(lVar32);
  lVar48 = lVar48 - iVar34;
  lVar32 = lVar33 >> 0x15;
  lVar39 = lVar32 + (lVar51 - iVar38) + lVar43 * -0xf39ad;
  iVar34 = int64_lshift21(lVar32);
  lVar33 = lVar33 - iVar34;
  lVar32 = lVar39 >> 0x15;
  lVar37 = lVar32 + lVar43 * 0x215d1 + (lVar37 - iVar47);
  iVar34 = int64_lshift21(lVar32);
  lVar39 = lVar39 - iVar34;
  lVar32 = lVar37 >> 0x15;
  lVar43 = lVar32 + (lVar28 - iVar42) + lVar43 * -0xa6f7d;
  iVar34 = int64_lshift21(lVar32);
  lVar37 = lVar37 - iVar34;
  lVar28 = lVar43 >> 0x15;
  lVar29 = lVar28 + (lVar29 - iVar52);
  iVar34 = int64_lshift21(lVar28);
  lVar43 = lVar43 - iVar34;
  lVar28 = lVar29 >> 0x15;
  lVar32 = lVar28 + (lVar27 - iVar44);
  iVar34 = int64_lshift21(lVar28);
  lVar29 = lVar29 - iVar34;
  lVar27 = lVar32 >> 0x15;
  lVar28 = lVar27 + (lVar30 - iVar53);
  iVar34 = int64_lshift21(lVar27);
  lVar32 = lVar32 - iVar34;
  lVar27 = lVar28 >> 0x15;
  lVar30 = lVar27 + (lVar26 - iVar40);
  iVar34 = int64_lshift21(lVar27);
  lVar28 = lVar28 - iVar34;
  lVar26 = lVar30 >> 0x15;
  lVar31 = lVar26 + (lVar31 - iVar54);
  iVar34 = int64_lshift21(lVar26);
  lVar30 = lVar30 - iVar34;
  lVar26 = lVar31 >> 0x15;
  lVar27 = lVar26 + (lVar35 - iVar55);
  iVar34 = int64_lshift21(lVar26);
  lVar31 = lVar31 - iVar34;
  *s = (uint8_t)lVar46;
  s[1] = (uint8_t)((ulong)lVar46 >> 8);
  s[2] = (byte)((ulong)lVar46 >> 0x10) | (char)lVar48 * ' ';
  s[3] = (uint8_t)(lVar48 >> 3);
  s[4] = (uint8_t)(lVar48 >> 0xb);
  s[5] = (byte)(lVar48 >> 0x13) | (char)lVar33 * '\x04';
  s[6] = (uint8_t)(lVar33 >> 6);
  s[7] = (byte)(lVar33 >> 0xe) | (char)lVar39 * -0x80;
  s[8] = (uint8_t)(lVar39 >> 1);
  s[9] = (uint8_t)(lVar39 >> 9);
  s[10] = (byte)(lVar39 >> 0x11) | (char)lVar37 * '\x10';
  s[0xb] = (uint8_t)(lVar37 >> 4);
  s[0xc] = (uint8_t)(lVar37 >> 0xc);
  s[0xd] = (byte)(lVar37 >> 0x14) | (char)lVar43 * '\x02';
  s[0xe] = (uint8_t)(lVar43 >> 7);
  s[0xf] = (byte)(lVar43 >> 0xf) | (char)lVar29 * '@';
  s[0x10] = (uint8_t)(lVar29 >> 2);
  s[0x11] = (uint8_t)(lVar29 >> 10);
  s[0x12] = (byte)(lVar29 >> 0x12) | (char)lVar32 * '\b';
  s[0x13] = (uint8_t)(lVar32 >> 5);
  s[0x14] = (uint8_t)(lVar32 >> 0xd);
  s[0x15] = (uint8_t)lVar28;
  s[0x16] = (uint8_t)((ulong)lVar28 >> 8);
  s[0x17] = (byte)((ulong)lVar28 >> 0x10) | (char)lVar30 * ' ';
  s[0x18] = (uint8_t)(lVar30 >> 3);
  s[0x19] = (uint8_t)(lVar30 >> 0xb);
  s[0x1a] = (byte)(lVar30 >> 0x13) | (char)lVar31 * '\x04';
  s[0x1b] = (uint8_t)(lVar31 >> 6);
  s[0x1c] = (byte)(lVar31 >> 0xe) | (char)lVar27 * -0x80;
  s[0x1d] = (uint8_t)(lVar27 >> 1);
  s[0x1e] = (uint8_t)(lVar27 >> 9);
  s[0x1f] = (uint8_t)(lVar27 >> 0x11);
  return;
}

Assistant:

void x25519_sc_reduce(uint8_t s[64]) {
  int64_t s0 = 2097151 & load_3(s);
  int64_t s1 = 2097151 & (load_4(s + 2) >> 5);
  int64_t s2 = 2097151 & (load_3(s + 5) >> 2);
  int64_t s3 = 2097151 & (load_4(s + 7) >> 7);
  int64_t s4 = 2097151 & (load_4(s + 10) >> 4);
  int64_t s5 = 2097151 & (load_3(s + 13) >> 1);
  int64_t s6 = 2097151 & (load_4(s + 15) >> 6);
  int64_t s7 = 2097151 & (load_3(s + 18) >> 3);
  int64_t s8 = 2097151 & load_3(s + 21);
  int64_t s9 = 2097151 & (load_4(s + 23) >> 5);
  int64_t s10 = 2097151 & (load_3(s + 26) >> 2);
  int64_t s11 = 2097151 & (load_4(s + 28) >> 7);
  int64_t s12 = 2097151 & (load_4(s + 31) >> 4);
  int64_t s13 = 2097151 & (load_3(s + 34) >> 1);
  int64_t s14 = 2097151 & (load_4(s + 36) >> 6);
  int64_t s15 = 2097151 & (load_3(s + 39) >> 3);
  int64_t s16 = 2097151 & load_3(s + 42);
  int64_t s17 = 2097151 & (load_4(s + 44) >> 5);
  int64_t s18 = 2097151 & (load_3(s + 47) >> 2);
  int64_t s19 = 2097151 & (load_4(s + 49) >> 7);
  int64_t s20 = 2097151 & (load_4(s + 52) >> 4);
  int64_t s21 = 2097151 & (load_3(s + 55) >> 1);
  int64_t s22 = 2097151 & (load_4(s + 57) >> 6);
  int64_t s23 = (load_4(s + 60) >> 3);
  int64_t carry0;
  int64_t carry1;
  int64_t carry2;
  int64_t carry3;
  int64_t carry4;
  int64_t carry5;
  int64_t carry6;
  int64_t carry7;
  int64_t carry8;
  int64_t carry9;
  int64_t carry10;
  int64_t carry11;
  int64_t carry12;
  int64_t carry13;
  int64_t carry14;
  int64_t carry15;
  int64_t carry16;

  s11 += s23 * 666643;
  s12 += s23 * 470296;
  s13 += s23 * 654183;
  s14 -= s23 * 997805;
  s15 += s23 * 136657;
  s16 -= s23 * 683901;
  s23 = 0;

  s10 += s22 * 666643;
  s11 += s22 * 470296;
  s12 += s22 * 654183;
  s13 -= s22 * 997805;
  s14 += s22 * 136657;
  s15 -= s22 * 683901;
  s22 = 0;

  s9 += s21 * 666643;
  s10 += s21 * 470296;
  s11 += s21 * 654183;
  s12 -= s21 * 997805;
  s13 += s21 * 136657;
  s14 -= s21 * 683901;
  s21 = 0;

  s8 += s20 * 666643;
  s9 += s20 * 470296;
  s10 += s20 * 654183;
  s11 -= s20 * 997805;
  s12 += s20 * 136657;
  s13 -= s20 * 683901;
  s20 = 0;

  s7 += s19 * 666643;
  s8 += s19 * 470296;
  s9 += s19 * 654183;
  s10 -= s19 * 997805;
  s11 += s19 * 136657;
  s12 -= s19 * 683901;
  s19 = 0;

  s6 += s18 * 666643;
  s7 += s18 * 470296;
  s8 += s18 * 654183;
  s9 -= s18 * 997805;
  s10 += s18 * 136657;
  s11 -= s18 * 683901;
  s18 = 0;

  carry6 = (s6 + (1 << 20)) >> 21;
  s7 += carry6;
  s6 -= int64_lshift21(carry6);
  carry8 = (s8 + (1 << 20)) >> 21;
  s9 += carry8;
  s8 -= int64_lshift21(carry8);
  carry10 = (s10 + (1 << 20)) >> 21;
  s11 += carry10;
  s10 -= int64_lshift21(carry10);
  carry12 = (s12 + (1 << 20)) >> 21;
  s13 += carry12;
  s12 -= int64_lshift21(carry12);
  carry14 = (s14 + (1 << 20)) >> 21;
  s15 += carry14;
  s14 -= int64_lshift21(carry14);
  carry16 = (s16 + (1 << 20)) >> 21;
  s17 += carry16;
  s16 -= int64_lshift21(carry16);

  carry7 = (s7 + (1 << 20)) >> 21;
  s8 += carry7;
  s7 -= int64_lshift21(carry7);
  carry9 = (s9 + (1 << 20)) >> 21;
  s10 += carry9;
  s9 -= int64_lshift21(carry9);
  carry11 = (s11 + (1 << 20)) >> 21;
  s12 += carry11;
  s11 -= int64_lshift21(carry11);
  carry13 = (s13 + (1 << 20)) >> 21;
  s14 += carry13;
  s13 -= int64_lshift21(carry13);
  carry15 = (s15 + (1 << 20)) >> 21;
  s16 += carry15;
  s15 -= int64_lshift21(carry15);

  s5 += s17 * 666643;
  s6 += s17 * 470296;
  s7 += s17 * 654183;
  s8 -= s17 * 997805;
  s9 += s17 * 136657;
  s10 -= s17 * 683901;
  s17 = 0;

  s4 += s16 * 666643;
  s5 += s16 * 470296;
  s6 += s16 * 654183;
  s7 -= s16 * 997805;
  s8 += s16 * 136657;
  s9 -= s16 * 683901;
  s16 = 0;

  s3 += s15 * 666643;
  s4 += s15 * 470296;
  s5 += s15 * 654183;
  s6 -= s15 * 997805;
  s7 += s15 * 136657;
  s8 -= s15 * 683901;
  s15 = 0;

  s2 += s14 * 666643;
  s3 += s14 * 470296;
  s4 += s14 * 654183;
  s5 -= s14 * 997805;
  s6 += s14 * 136657;
  s7 -= s14 * 683901;
  s14 = 0;

  s1 += s13 * 666643;
  s2 += s13 * 470296;
  s3 += s13 * 654183;
  s4 -= s13 * 997805;
  s5 += s13 * 136657;
  s6 -= s13 * 683901;
  s13 = 0;

  s0 += s12 * 666643;
  s1 += s12 * 470296;
  s2 += s12 * 654183;
  s3 -= s12 * 997805;
  s4 += s12 * 136657;
  s5 -= s12 * 683901;
  s12 = 0;

  carry0 = (s0 + (1 << 20)) >> 21;
  s1 += carry0;
  s0 -= int64_lshift21(carry0);
  carry2 = (s2 + (1 << 20)) >> 21;
  s3 += carry2;
  s2 -= int64_lshift21(carry2);
  carry4 = (s4 + (1 << 20)) >> 21;
  s5 += carry4;
  s4 -= int64_lshift21(carry4);
  carry6 = (s6 + (1 << 20)) >> 21;
  s7 += carry6;
  s6 -= int64_lshift21(carry6);
  carry8 = (s8 + (1 << 20)) >> 21;
  s9 += carry8;
  s8 -= int64_lshift21(carry8);
  carry10 = (s10 + (1 << 20)) >> 21;
  s11 += carry10;
  s10 -= int64_lshift21(carry10);

  carry1 = (s1 + (1 << 20)) >> 21;
  s2 += carry1;
  s1 -= int64_lshift21(carry1);
  carry3 = (s3 + (1 << 20)) >> 21;
  s4 += carry3;
  s3 -= int64_lshift21(carry3);
  carry5 = (s5 + (1 << 20)) >> 21;
  s6 += carry5;
  s5 -= int64_lshift21(carry5);
  carry7 = (s7 + (1 << 20)) >> 21;
  s8 += carry7;
  s7 -= int64_lshift21(carry7);
  carry9 = (s9 + (1 << 20)) >> 21;
  s10 += carry9;
  s9 -= int64_lshift21(carry9);
  carry11 = (s11 + (1 << 20)) >> 21;
  s12 += carry11;
  s11 -= int64_lshift21(carry11);

  s0 += s12 * 666643;
  s1 += s12 * 470296;
  s2 += s12 * 654183;
  s3 -= s12 * 997805;
  s4 += s12 * 136657;
  s5 -= s12 * 683901;
  s12 = 0;

  carry0 = s0 >> 21;
  s1 += carry0;
  s0 -= int64_lshift21(carry0);
  carry1 = s1 >> 21;
  s2 += carry1;
  s1 -= int64_lshift21(carry1);
  carry2 = s2 >> 21;
  s3 += carry2;
  s2 -= int64_lshift21(carry2);
  carry3 = s3 >> 21;
  s4 += carry3;
  s3 -= int64_lshift21(carry3);
  carry4 = s4 >> 21;
  s5 += carry4;
  s4 -= int64_lshift21(carry4);
  carry5 = s5 >> 21;
  s6 += carry5;
  s5 -= int64_lshift21(carry5);
  carry6 = s6 >> 21;
  s7 += carry6;
  s6 -= int64_lshift21(carry6);
  carry7 = s7 >> 21;
  s8 += carry7;
  s7 -= int64_lshift21(carry7);
  carry8 = s8 >> 21;
  s9 += carry8;
  s8 -= int64_lshift21(carry8);
  carry9 = s9 >> 21;
  s10 += carry9;
  s9 -= int64_lshift21(carry9);
  carry10 = s10 >> 21;
  s11 += carry10;
  s10 -= int64_lshift21(carry10);
  carry11 = s11 >> 21;
  s12 += carry11;
  s11 -= int64_lshift21(carry11);

  s0 += s12 * 666643;
  s1 += s12 * 470296;
  s2 += s12 * 654183;
  s3 -= s12 * 997805;
  s4 += s12 * 136657;
  s5 -= s12 * 683901;
  s12 = 0;

  carry0 = s0 >> 21;
  s1 += carry0;
  s0 -= int64_lshift21(carry0);
  carry1 = s1 >> 21;
  s2 += carry1;
  s1 -= int64_lshift21(carry1);
  carry2 = s2 >> 21;
  s3 += carry2;
  s2 -= int64_lshift21(carry2);
  carry3 = s3 >> 21;
  s4 += carry3;
  s3 -= int64_lshift21(carry3);
  carry4 = s4 >> 21;
  s5 += carry4;
  s4 -= int64_lshift21(carry4);
  carry5 = s5 >> 21;
  s6 += carry5;
  s5 -= int64_lshift21(carry5);
  carry6 = s6 >> 21;
  s7 += carry6;
  s6 -= int64_lshift21(carry6);
  carry7 = s7 >> 21;
  s8 += carry7;
  s7 -= int64_lshift21(carry7);
  carry8 = s8 >> 21;
  s9 += carry8;
  s8 -= int64_lshift21(carry8);
  carry9 = s9 >> 21;
  s10 += carry9;
  s9 -= int64_lshift21(carry9);
  carry10 = s10 >> 21;
  s11 += carry10;
  s10 -= int64_lshift21(carry10);

  s[0] = s0 >> 0;
  s[1] = s0 >> 8;
  s[2] = (s0 >> 16) | (s1 << 5);
  s[3] = s1 >> 3;
  s[4] = s1 >> 11;
  s[5] = (s1 >> 19) | (s2 << 2);
  s[6] = s2 >> 6;
  s[7] = (s2 >> 14) | (s3 << 7);
  s[8] = s3 >> 1;
  s[9] = s3 >> 9;
  s[10] = (s3 >> 17) | (s4 << 4);
  s[11] = s4 >> 4;
  s[12] = s4 >> 12;
  s[13] = (s4 >> 20) | (s5 << 1);
  s[14] = s5 >> 7;
  s[15] = (s5 >> 15) | (s6 << 6);
  s[16] = s6 >> 2;
  s[17] = s6 >> 10;
  s[18] = (s6 >> 18) | (s7 << 3);
  s[19] = s7 >> 5;
  s[20] = s7 >> 13;
  s[21] = s8 >> 0;
  s[22] = s8 >> 8;
  s[23] = (s8 >> 16) | (s9 << 5);
  s[24] = s9 >> 3;
  s[25] = s9 >> 11;
  s[26] = (s9 >> 19) | (s10 << 2);
  s[27] = s10 >> 6;
  s[28] = (s10 >> 14) | (s11 << 7);
  s[29] = s11 >> 1;
  s[30] = s11 >> 9;
  s[31] = s11 >> 17;
}